

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int verify_miniscript_wrapper_t(miniscript_node_t *node,miniscript_node_t *parent)

{
  uint32_t uVar1;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  uVar1 = verify_miniscript_and_v_property(node->type_properties,0x35101);
  node->type_properties = uVar1;
  if ((node->type_properties & 0xf) == 0) {
    node_local._4_4_ = -2;
  }
  else {
    node_local._4_4_ = 0;
  }
  return node_local._4_4_;
}

Assistant:

static int verify_miniscript_wrapper_t(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    (void)parent;
    node->type_properties = verify_miniscript_and_v_property(
        node->type_properties, MINISCRIPT_PROPERTY_OP_1);
    if (!(node->type_properties & MINISCRIPT_TYPE_MASK))
        return WALLY_EINVAL;
    /* prop >= MINISCRIPT_PROPERTY_F */
    return WALLY_OK;
}